

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XMLNodeAdapter.cxx
# Opt level: O1

optional<XMLNodeAdapter> *
getTopNodeFromFile(optional<XMLNodeAdapter> *__return_storage_ptr__,string_view fileName,
                  string_view topNodeName)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var1;
  char cVar2;
  XMLNode node;
  XMLNode XStack_48;
  XMLNode local_40;
  XMLNodeAdapter local_38;
  
  XMLParser::XMLNode::openFileHelperThrows(&XStack_48,fileName._M_str,topNodeName._M_str);
  cVar2 = XMLParser::XMLNode::isEmpty(&XStack_48);
  if (cVar2 == '\0') {
    XMLParser::XMLNode::XMLNode(&local_40,&XStack_48);
    XMLNodeAdapter::XMLNodeAdapter(&local_38,&local_40);
    _Var1._M_pi = local_38.pimpl_.
                  super___shared_ptr<XMLNodeAdapter::Impl,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                  _M_pi;
    (__return_storage_ptr__->super__Optional_base<XMLNodeAdapter,_false,_false>)._M_payload.
    super__Optional_payload<XMLNodeAdapter,_true,_false,_false>.
    super__Optional_payload_base<XMLNodeAdapter>._M_payload._M_value.
    super_INodeAdapter<XMLNodeAdapter>._vptr_INodeAdapter =
         (_func_int **)&PTR__XMLNodeAdapter_001ddbc0;
    (__return_storage_ptr__->super__Optional_base<XMLNodeAdapter,_false,_false>)._M_payload.
    super__Optional_payload<XMLNodeAdapter,_true,_false,_false>.
    super__Optional_payload_base<XMLNodeAdapter>._M_payload._M_value.pimpl_.
    super___shared_ptr<XMLNodeAdapter::Impl,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         local_38.pimpl_.super___shared_ptr<XMLNodeAdapter::Impl,_(__gnu_cxx::_Lock_policy)2>._M_ptr
    ;
    ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
    ((long)&(__return_storage_ptr__->super__Optional_base<XMLNodeAdapter,_false,_false>)._M_payload.
            super__Optional_payload<XMLNodeAdapter,_true,_false,_false>.
            super__Optional_payload_base<XMLNodeAdapter>._M_payload._M_value.pimpl_.
            super___shared_ptr<XMLNodeAdapter::Impl,_(__gnu_cxx::_Lock_policy)2> + 8))->_M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    local_38.pimpl_.super___shared_ptr<XMLNodeAdapter::Impl,_(__gnu_cxx::_Lock_policy)2>._M_refcount
    ._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
    ((long)&(__return_storage_ptr__->super__Optional_base<XMLNodeAdapter,_false,_false>)._M_payload.
            super__Optional_payload<XMLNodeAdapter,_true,_false,_false>.
            super__Optional_payload_base<XMLNodeAdapter>._M_payload._M_value.pimpl_.
            super___shared_ptr<XMLNodeAdapter::Impl,_(__gnu_cxx::_Lock_policy)2> + 8))->_M_pi =
         _Var1._M_pi;
    local_38.pimpl_.super___shared_ptr<XMLNodeAdapter::Impl,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)0x0;
    (__return_storage_ptr__->super__Optional_base<XMLNodeAdapter,_false,_false>)._M_payload.
    super__Optional_payload<XMLNodeAdapter,_true,_false,_false>.
    super__Optional_payload_base<XMLNodeAdapter>._M_engaged = true;
    local_38.super_INodeAdapter<XMLNodeAdapter>._vptr_INodeAdapter =
         (_func_int **)&PTR__XMLNodeAdapter_001ddbc0;
    XMLParser::XMLNode::~XMLNode(&local_40);
    XMLParser::XMLNode::~XMLNode(&XStack_48);
  }
  else {
    XMLParser::XMLNode::~XMLNode(&XStack_48);
    (__return_storage_ptr__->super__Optional_base<XMLNodeAdapter,_false,_false>)._M_payload.
    super__Optional_payload<XMLNodeAdapter,_true,_false,_false>.
    super__Optional_payload_base<XMLNodeAdapter>._M_engaged = false;
  }
  return __return_storage_ptr__;
}

Assistant:

std::optional<XMLNodeAdapter> getTopNodeFromFile(std::string_view fileName,
                                                 std::string_view topNodeName)
{
    try
    {
        auto node = XMLParser::XMLNode::openFileHelperThrows(fileName.data(), topNodeName.data());
        if(!node.isEmpty())
        {
            return XMLNodeAdapter(node);
        }
    }
    catch(const std::exception &)
    {
        // No need to log message for now. Empty optional will be returned indicating failure.
    }
    // Return empty optional if node is empty or an exception occurred
    return std::nullopt;
}